

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O0

void __thiscall
gimage::anon_unknown_6::TiffImage<unsigned_char>::TiffImage
          (TiffImage<unsigned_char> *this,char *name)

{
  IOException *this_00;
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  uint16_t planar;
  uint16_t format;
  int in_stack_ffffffffffffff2c;
  long in_stack_ffffffffffffff30;
  long in_stack_ffffffffffffff38;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_ffffffffffffff40;
  allocator *paVar2;
  string *message;
  allocator local_81;
  string local_80 [96];
  short local_20;
  short local_1e [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_10 = in_RSI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff2c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x15eaf1);
  message = (string *)(in_RDI + 0xf);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x15eb04);
  this_00 = (IOException *)TIFFOpen(local_10,"r");
  *in_RDI = (long)this_00;
  if (*in_RDI != 0) {
    TIFFGetField(*in_RDI,0x100,in_RDI + 1);
    TIFFGetField(*in_RDI,0x101,(long)in_RDI + 0xc);
    TIFFGetField(*in_RDI,0x115,in_RDI + 2);
    TIFFGetField(*in_RDI,0x102,(long)in_RDI + 0x12);
    TIFFGetField(*in_RDI,0x153,local_1e);
    TIFFGetField(*in_RDI,0x11c,&local_20);
    *(bool *)((long)in_RDI + 0x14) = local_1e[0] == 3;
    *(bool *)((long)in_RDI + 0x15) = local_20 == 2;
    lVar1 = TIFFScanlineSize(*in_RDI);
    in_RDI[3] = lVar1;
    TIFFGetField(*in_RDI,0x106,in_RDI + 4);
    return;
  }
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x28);
  paVar2 = &local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,(char *)local_10,paVar2);
  std::operator+((char *)local_10,__rhs);
  std::operator+(local_10,(char *)__rhs);
  gutil::IOException::IOException(this_00,message);
  __cxa_throw(__rhs,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

TiffImage(const char *name)
    {
      tif=TIFFOpen(name, "r");

      if (tif)
      {
        TIFFGetField(tif, TIFFTAG_IMAGEWIDTH, &width);
        TIFFGetField(tif, TIFFTAG_IMAGELENGTH, &height);
        TIFFGetField(tif, TIFFTAG_SAMPLESPERPIXEL, &depth);
        TIFFGetField(tif, TIFFTAG_BITSPERSAMPLE, &bits);

        uint16_t format;
        uint16_t planar;

        TIFFGetField(tif, TIFFTAG_SAMPLEFORMAT, &format);
        TIFFGetField(tif, TIFFTAG_PLANARCONFIG, &planar);

        is_float=(format == SAMPLEFORMAT_IEEEFP);
        is_planar=(planar == PLANARCONFIG_SEPARATE);

        raw_size=TIFFScanlineSize(tif);
        TIFFGetField(tif, TIFFTAG_PHOTOMETRIC, &photometric);
      }
      else
      {
        throw gutil::IOException("Can only load TIFF image ("+std::string(name)+")");
      }
    }